

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_get_sample_position(Impl *impl,CallInst *instruction,bool image)

{
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  Operation *pOVar5;
  Builder *this_00;
  Operation *pOVar6;
  Operation *this_01;
  Operation *this_02;
  undefined7 in_register_00000011;
  undefined4 *puVar7;
  uint index;
  uint j;
  long lVar8;
  size_t i;
  long lVar9;
  Id local_78;
  Vector<spv::Id> constituents;
  Id local_3c [3];
  
  this = Converter::Impl::builder(impl);
  if ((int)CONCAT71(in_register_00000011,image) == 0) {
    local_78 = build_rasterizer_sample_count(impl);
    index = 1;
  }
  else {
    index = 2;
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    IVar2 = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,OpImageQuerySamples,IVar2);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    local_78 = pOVar5->id;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  this_00 = Converter::Impl::builder(impl);
  if (impl->texture_sample_pos_lut_id == 0) {
    IVar2 = spv::Builder::makeFloatType(this_00,0x20);
    IVar2 = spv::Builder::makeVectorType(this_00,IVar2,2);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&constituents,0x1f,(allocator_type *)local_3c);
    puVar7 = &build_sample_position_lut(dxil_spv::Converter::Impl&)::standard_sample_positions;
    for (lVar9 = 0; lVar9 != 0x1f; lVar9 = lVar9 + 1) {
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        IVar3 = spv::Builder::makeFloatConstant(this_00,(float)puVar7[lVar8],false);
        local_3c[lVar8] = IVar3;
      }
      IVar3 = spv::Builder::makeFloatType(this_00,0x20);
      IVar3 = Converter::Impl::build_constant_vector(impl,IVar3,local_3c,2);
      constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar9] = IVar3;
      puVar7 = puVar7 + 2;
    }
    IVar3 = spv::Builder::makeUintConstant(this_00,0x1f,false);
    IVar2 = spv::Builder::makeArrayType(this_00,IVar2,IVar3,0);
    IVar3 = spv::Builder::makeCompositeConstant
                      (this_00,IVar2,
                       (Vector<Id> *)
                       &constituents.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ,false);
    IVar2 = Converter::Impl::create_variable_with_initializer
                      (impl,StorageClassPrivate,IVar2,IVar3,"Texture2DMSSamplePositionLUT");
    impl->texture_sample_pos_lut_id = IVar2;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&constituents.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  }
  IVar2 = spv::Builder::makeUintType(this,0x20);
  pOVar5 = Converter::Impl::allocate(impl,OpISub,IVar2);
  local_3c[0] = local_78;
  local_3c[1] = spv::Builder::makeUintConstant(this,1,false);
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,pOVar5,false);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  pOVar6 = Converter::Impl::allocate(impl,OpIAdd,IVar2);
  local_3c[0] = pOVar5->id;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  local_3c[1] = IVar1;
  Operation::add_ids(pOVar6,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,pOVar6,false);
  IVar2 = spv::Builder::makeBoolType(this);
  pOVar5 = Converter::Impl::allocate(impl,OpULessThan,IVar2);
  local_3c[1] = local_78;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  local_3c[0] = IVar1;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,pOVar5,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_01 = Converter::Impl::allocate(impl,OpULessThanEqual,IVar1);
  local_3c[0] = local_78;
  local_3c[1] = spv::Builder::makeUintConstant(this,0x10,false);
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  Operation::add_ids(this_01,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,this_01,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_02 = Converter::Impl::allocate(impl,OpLogicalAnd,IVar1);
  local_3c[0] = pOVar5->id;
  local_3c[1] = this_01->id;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  Operation::add_ids(this_02,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,this_02,false);
  IVar1 = spv::Builder::makeUintType(this,0x20);
  pOVar5 = Converter::Impl::allocate(impl,OpSelect,IVar1);
  local_3c[0] = this_02->id;
  local_3c[1] = pOVar6->id;
  local_3c[2] = spv::Builder::makeUintConstant(this,0,false);
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,pOVar5,false);
  IVar1 = spv::Builder::makeFloatType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  IVar2 = spv::Builder::makePointer(this,StorageClassPrivate,IVar1);
  pOVar6 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  local_3c[0] = impl->texture_sample_pos_lut_id;
  local_3c[1] = pOVar5->id;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = local_3c;
  Operation::add_ids(pOVar6,(initializer_list<unsigned_int> *)&constituents);
  Converter::Impl::add(impl,pOVar6,false);
  pOVar5 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,IVar1);
  Operation::add_id(pOVar5,pOVar6->id);
  Converter::Impl::add(impl,pOVar5,false);
  spv::Builder::addCapability(this,CapabilityImageQuery);
  return true;
}

Assistant:

bool emit_get_sample_position(Converter::Impl &impl, const llvm::CallInst *instruction, bool image)
{
	auto &builder = impl.builder();

	spv::Id sample_count_id;
	if (image)
	{
		spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

		auto *query_samples_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
		query_samples_op->add_id(image_id);
		impl.add(query_samples_op);
		sample_count_id = query_samples_op->id;
	}
	else
	{
		sample_count_id = build_rasterizer_sample_count(impl);
	}

	spv::Id sample_index_id = impl.get_id_for_value(instruction->getOperand(image ? 2 : 1));

	// Build the LUT if we have to.
	build_sample_position_lut(impl);

	// Sample count is only POT, so table starts at N - 1.
	auto *lut_base_offset_op = impl.allocate(spv::OpISub, builder.makeUintType(32));
	lut_base_offset_op->add_ids({ sample_count_id, builder.makeUintConstant(1) });
	impl.add(lut_base_offset_op);

	// Build LUT offset.
	auto *lut_offset_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
	lut_offset_op->add_ids({ lut_base_offset_op->id, sample_index_id });
	impl.add(lut_offset_op);

	// Range check sample index against actual texture.
	auto *cmp0_op = impl.allocate(spv::OpULessThan, builder.makeBoolType());
	cmp0_op->add_ids({ sample_index_id, sample_count_id });
	impl.add(cmp0_op);

	// Range check sample index against max supported 16.
	auto *cmp1_op = impl.allocate(spv::OpULessThanEqual, builder.makeBoolType());
	cmp1_op->add_ids({ sample_count_id, builder.makeUintConstant(16) });
	impl.add(cmp1_op);

	auto *cmp_op = impl.allocate(spv::OpLogicalAnd, builder.makeBoolType());
	cmp_op->add_ids({ cmp0_op->id, cmp1_op->id });
	impl.add(cmp_op);

	auto *final_lut_index_op = impl.allocate(spv::OpSelect, builder.makeUintType(32));
	final_lut_index_op->add_ids({ cmp_op->id, lut_offset_op->id, builder.makeUintConstant(0) });
	impl.add(final_lut_index_op);

	spv::Id vec2_type = builder.makeVectorType(builder.makeFloatType(32), 2);

	auto *chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassPrivate, vec2_type));
	chain_op->add_ids({ impl.texture_sample_pos_lut_id, final_lut_index_op->id });
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, instruction, vec2_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}